

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void ClosePendingUpvalues(ExpressionContext *ctx,FunctionData *function)

{
  VariableHandle *pVVar1;
  ExprSequence *pEVar2;
  VariableData *pVVar3;
  ExpressionContext *pEVar4;
  ExpressionContext *ctx_00;
  FunctionData *pFVar5;
  SynBase *pSVar6;
  VariableData **ppVVar7;
  uint i;
  uint uVar8;
  ScopeData *pSVar9;
  IntrusiveList<VariableHandle> *pIVar10;
  IntrusiveList<CloseUpvaluesData> *pIVar11;
  CloseUpvaluesData *pCVar12;
  ExprBase *local_58;
  ExpressionContext *local_50;
  FunctionData *local_48;
  CloseUpvaluesData *local_40;
  IntrusiveList<VariableHandle> *local_38;
  
  pFVar5 = ExpressionContext::GetCurrentFunction(ctx,ctx->scope);
  if (pFVar5 != function) {
    __assert_fail("function == ctx.GetCurrentFunction(ctx.scope)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0xb2b,"void ClosePendingUpvalues(ExpressionContext &, FunctionData *)");
  }
  pIVar11 = &function->closeUpvalues;
  if (function == (FunctionData *)0x0) {
    pIVar11 = &ctx->globalCloseUpvalues;
  }
  local_38 = &function->argumentVariables;
  local_50 = ctx;
  local_48 = function;
  do {
    pEVar4 = local_50;
    pCVar12 = pIVar11->head;
    if (pCVar12 == (CloseUpvaluesData *)0x0) {
      return;
    }
    local_40 = pCVar12;
    switch(pCVar12->type) {
    case CLOSE_UPVALUES_FUNCTION:
      if (local_48 == (FunctionData *)0x0) {
        __assert_fail("function",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0xb34,"void ClosePendingUpvalues(ExpressionContext &, FunctionData *)");
      }
      pSVar9 = (ScopeData *)&pCVar12->scope;
      do {
        pSVar9 = pSVar9->scope;
        if (pSVar9 == (ScopeData *)0x0) break;
        for (uVar8 = 0; uVar8 < (pSVar9->variables).count; uVar8 = uVar8 + 1) {
          ppVVar7 = SmallArray<VariableData_*,_4U>::operator[](&pSVar9->variables,uVar8);
          pEVar4 = local_50;
          pVVar3 = *ppVVar7;
          if (pVVar3->usedAsExternal == true) {
            pEVar2 = pCVar12->expr;
            pSVar6 = &ExpressionContext::MakeInternal(local_50,pCVar12->source)->super_SynBase;
            pCVar12 = local_40;
            local_58 = CreateUpvalueClose(pEVar4,pSVar6,pVVar3);
            SmallArray<ExprBase_*,_4U>::push_back(&pEVar2->expressions,&local_58);
          }
        }
      } while (pSVar9->ownerFunction == (FunctionData *)0x0);
      break;
    case CLOSE_UPVALUES_BLOCK:
      for (uVar8 = 0; uVar8 < (pCVar12->scope->variables).count; uVar8 = uVar8 + 1) {
        ppVVar7 = SmallArray<VariableData_*,_4U>::operator[](&pCVar12->scope->variables,uVar8);
        pEVar4 = local_50;
        pVVar3 = *ppVVar7;
        if (pVVar3->usedAsExternal == true) {
          pEVar2 = pCVar12->expr;
          pSVar6 = &ExpressionContext::MakeInternal(local_50,pCVar12->source)->super_SynBase;
          local_58 = CreateUpvalueClose(pEVar4,pSVar6,pVVar3);
          SmallArray<ExprBase_*,_4U>::push_back(&pEVar2->expressions,&local_58);
        }
      }
      break;
    case CLOSE_UPVALUES_BREAK:
      pSVar9 = (ScopeData *)&pCVar12->scope;
      while ((pSVar9 = pSVar9->scope, pSVar9 != (ScopeData *)0x0 &&
             (pSVar9->breakDepth != pCVar12->scope->breakDepth - pCVar12->depth))) {
        for (uVar8 = 0; uVar8 < (pSVar9->variables).count; uVar8 = uVar8 + 1) {
          ppVVar7 = SmallArray<VariableData_*,_4U>::operator[](&pSVar9->variables,uVar8);
          pEVar4 = local_50;
          pVVar3 = *ppVVar7;
          if (pVVar3->usedAsExternal == true) {
            pEVar2 = pCVar12->expr;
            pSVar6 = &ExpressionContext::MakeInternal(local_50,pCVar12->source)->super_SynBase;
            pCVar12 = local_40;
            local_58 = CreateUpvalueClose(pEVar4,pSVar6,pVVar3);
            SmallArray<ExprBase_*,_4U>::push_back(&pEVar2->expressions,&local_58);
          }
        }
      }
      break;
    case CLOSE_UPVALUES_CONTINUE:
      pSVar9 = (ScopeData *)&pCVar12->scope;
      while ((pSVar9 = pSVar9->scope, pSVar9 != (ScopeData *)0x0 &&
             (pSVar9->contiueDepth != pCVar12->scope->contiueDepth - pCVar12->depth))) {
        for (uVar8 = 0; uVar8 < (pSVar9->variables).count; uVar8 = uVar8 + 1) {
          ppVVar7 = SmallArray<VariableData_*,_4U>::operator[](&pSVar9->variables,uVar8);
          pEVar4 = local_50;
          pVVar3 = *ppVVar7;
          if (pVVar3->usedAsExternal == true) {
            pEVar2 = pCVar12->expr;
            pSVar6 = &ExpressionContext::MakeInternal(local_50,pCVar12->source)->super_SynBase;
            pCVar12 = local_40;
            local_58 = CreateUpvalueClose(pEVar4,pSVar6,pVVar3);
            SmallArray<ExprBase_*,_4U>::push_back(&pEVar2->expressions,&local_58);
          }
        }
      }
      break;
    case CLOSE_UPVALUES_ARGUMENT:
      pIVar10 = local_38;
      if (local_48 == (FunctionData *)0x0) {
        __assert_fail("function",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0xb6c,"void ClosePendingUpvalues(ExpressionContext &, FunctionData *)");
      }
      while (ctx_00 = local_50, pVVar1 = pIVar10->head, pVVar1 != (VariableHandle *)0x0) {
        if (pVVar1->variable->usedAsExternal == true) {
          pEVar2 = pCVar12->expr;
          pSVar6 = &ExpressionContext::MakeInternal(pEVar4,pCVar12->source)->super_SynBase;
          local_58 = CreateUpvalueClose(pEVar4,pSVar6,pVVar1->variable);
          SmallArray<ExprBase_*,_4U>::push_back(&pEVar2->expressions,&local_58);
        }
        pIVar10 = (IntrusiveList<VariableHandle> *)&pVVar1->next;
      }
      pVVar3 = local_48->contextArgument;
      if ((pVVar3 != (VariableData *)0x0) && (pVVar3->usedAsExternal == true)) {
        pEVar2 = pCVar12->expr;
        pSVar6 = &ExpressionContext::MakeInternal(local_50,pCVar12->source)->super_SynBase;
        local_58 = CreateUpvalueClose(ctx_00,pSVar6,pVVar3);
        SmallArray<ExprBase_*,_4U>::push_back(&pEVar2->expressions,&local_58);
      }
    }
    pIVar11 = (IntrusiveList<CloseUpvaluesData> *)&pCVar12->next;
  } while( true );
}

Assistant:

void ClosePendingUpvalues(ExpressionContext &ctx, FunctionData *function)
{
	IntrusiveList<CloseUpvaluesData> &closeUpvalues = function ? function->closeUpvalues : ctx.globalCloseUpvalues;

	assert(function == ctx.GetCurrentFunction(ctx.scope));

	for(CloseUpvaluesData *curr = closeUpvalues.head; curr; curr = curr->next)
	{
		CloseUpvaluesData &data = *curr;

		switch(data.type)
		{
		case CLOSE_UPVALUES_FUNCTION:
			assert(function);

			for(ScopeData *scope = data.scope; scope; scope = scope->scope)
			{
				for(unsigned i = 0; i < scope->variables.size(); i++)
				{
					VariableData *variable = scope->variables[i];

					if(variable->usedAsExternal)
						data.expr->expressions.push_back(CreateUpvalueClose(ctx, ctx.MakeInternal(data.source), variable));
				}

				if(scope->ownerFunction)
					break;
			}
			break;
		case CLOSE_UPVALUES_BLOCK:
			for(unsigned i = 0; i < data.scope->variables.size(); i++)
			{
				VariableData *variable = data.scope->variables[i];

				if(variable->usedAsExternal)
					data.expr->expressions.push_back(CreateUpvalueClose(ctx, ctx.MakeInternal(data.source), variable));
			}
			break;
		case CLOSE_UPVALUES_BREAK:
			for(ScopeData *scope = data.scope; scope; scope = scope->scope)
			{
				if(scope->breakDepth == data.scope->breakDepth - data.depth)
					break;

				for(unsigned i = 0; i < scope->variables.size(); i++)
				{
					VariableData *variable = scope->variables[i];

					if(variable->usedAsExternal)
						data.expr->expressions.push_back(CreateUpvalueClose(ctx, ctx.MakeInternal(data.source), variable));
				}
			}
			break;
		case CLOSE_UPVALUES_CONTINUE:
			for(ScopeData *scope = data.scope; scope; scope = scope->scope)
			{
				if(scope->contiueDepth == data.scope->contiueDepth - data.depth)
					break;

				for(unsigned i = 0; i < scope->variables.size(); i++)
				{
					VariableData *variable = scope->variables[i];

					if(variable->usedAsExternal)
						data.expr->expressions.push_back(CreateUpvalueClose(ctx, ctx.MakeInternal(data.source), variable));
				}
			}
			break;
		case CLOSE_UPVALUES_ARGUMENT:
			assert(function);

			for(VariableHandle *curr = function->argumentVariables.head; curr; curr = curr->next)
			{
				if(curr->variable->usedAsExternal)
					data.expr->expressions.push_back(CreateUpvalueClose(ctx, ctx.MakeInternal(data.source), curr->variable));
			}

			if(VariableData *variable = function->contextArgument)
			{
				if(variable->usedAsExternal)
					data.expr->expressions.push_back(CreateUpvalueClose(ctx, ctx.MakeInternal(data.source), variable));
			}
		}
	}
}